

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_p_race_age(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  player_race *r;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"base_age");
    *(wchar_t *)((long)pvVar2 + 0x1c) = wVar1;
    wVar1 = parser_getint(p,"mod_age");
    *(wchar_t *)((long)pvVar2 + 0x20) = wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_p_race_age(struct parser *p) {
	struct player_race *r = parser_priv(p);
	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	r->b_age = parser_getint(p, "base_age");
	r->m_age = parser_getint(p, "mod_age");
	return PARSE_ERROR_NONE;
}